

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_00;
  streambuf *psVar1;
  DebugOutStream *this_local;
  
  IStream::IStream(&this->super_IStream);
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__DebugOutStream_00238440;
  this_00 = (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)operator_new(0x148);
  StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl(this_00);
  std::unique_ptr<Catch::StreamBufBase,std::default_delete<Catch::StreamBufBase>>::
  unique_ptr<std::default_delete<Catch::StreamBufBase>,void>
            ((unique_ptr<Catch::StreamBufBase,std::default_delete<Catch::StreamBufBase>> *)
             &this->m_streamBuf,(pointer)this_00);
  psVar1 = &std::unique_ptr<Catch::StreamBufBase,_std::default_delete<Catch::StreamBufBase>_>::get
                      (&this->m_streamBuf)->super_streambuf;
  std::ostream::ostream(&this->m_os,psVar1);
  return;
}

Assistant:

DebugOutStream::DebugOutStream()
    :   m_streamBuf( new StreamBufImpl<OutputDebugWriter>() ),
        m_os( m_streamBuf.get() )
    {}